

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalMap.c
# Opt level: O2

Gia_Man_t * Gia_ManExtractWin(Gia_Man_t *p,Vec_Int_t *vOuts,int fPoOnly)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pObj;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  Vec_Int_t *vAnds;
  Vec_Int_t *vPos;
  Vec_Int_t *vPis;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  Gia_ManPrepareWin(p,vOuts,&local_38,&local_40,&local_48,fPoOnly);
  p_00 = Gia_ManStart(local_48->nSize + local_38->nSize + local_40->nSize + 1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  p->pObjs->Value = 0;
  for (iVar7 = 0; iVar7 < local_38->nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(local_38,iVar7);
    pGVar5 = Gia_ManObj(p,iVar1);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar2 = Gia_ManAppendCi(p_00);
    pGVar5->Value = uVar2;
  }
  for (iVar7 = 0; iVar7 < local_48->nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(local_48,iVar7);
    pGVar5 = Gia_ManObj(p,iVar1);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar2 = Gia_ObjFanin0Copy(pGVar5);
    uVar3 = Gia_ObjFanin1Copy(pGVar5);
    pObj = Gia_ManAppendObj(p_00);
    uVar12 = uVar2 >> 1;
    if (p_00->nObjs <= (int)uVar12) {
      __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2a8,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
    }
    uVar8 = uVar3 >> 1;
    if ((uint)p_00->nObjs <= uVar8) {
      __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
    }
    if ((uVar12 == uVar8) && (p_00->fGiaSimple == 0)) {
      __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
    }
    iVar1 = Gia_ObjId(p_00,pObj);
    uVar11 = (ulong)(iVar1 - uVar12 & 0x1fffffff);
    if (uVar2 < uVar3) {
      *(ulong *)pObj = (ulong)((uVar2 & 1) << 0x1d) | *(ulong *)pObj & 0xffffffffc0000000 | uVar11;
      iVar1 = Gia_ObjId(p_00,pObj);
      uVar11 = (ulong)(uVar3 & 1) << 0x3d |
               *(ulong *)pObj & 0xc0000000ffffffff | (ulong)(iVar1 - uVar8 & 0x1fffffff) << 0x20;
    }
    else {
      *(ulong *)pObj =
           (ulong)(uVar2 & 1) << 0x3d | *(ulong *)pObj & 0xc0000000ffffffff | uVar11 << 0x20;
      iVar1 = Gia_ObjId(p_00,pObj);
      uVar11 = (ulong)((uVar3 & 1) << 0x1d) | *(ulong *)pObj & 0xffffffffc0000000 |
               (ulong)(iVar1 - uVar8 & 0x1fffffff);
    }
    *(ulong *)pObj = uVar11;
    if (p_00->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(p_00,pObj + -(uVar11 & 0x1fffffff),pObj);
      Gia_ObjAddFanout(p_00,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),pObj);
    }
    if (p_00->fSweeper != 0) {
      uVar6 = *(ulong *)pObj & 0x1fffffff;
      uVar11 = *(ulong *)pObj >> 0x20 & 0x1fffffff;
      uVar9 = 0x4000000000000000;
      if (((uint)*(ulong *)(pObj + -uVar6) >> 0x1e & 1) == 0) {
        uVar9 = 0x40000000;
      }
      *(ulong *)(pObj + -uVar6) = uVar9 | *(ulong *)(pObj + -uVar6);
      uVar9 = *(ulong *)(pObj + -uVar11);
      uVar10 = 0x4000000000000000;
      if (((uint)uVar9 >> 0x1e & 1) == 0) {
        uVar10 = 0x40000000;
      }
      *(ulong *)(pObj + -uVar11) = uVar10 | uVar9;
      uVar11 = *(ulong *)pObj;
      *(ulong *)pObj =
           uVar11 & 0x7fffffffffffffff |
           (ulong)(((uint)(uVar11 >> 0x3d) ^ (uint)(uVar9 >> 0x3f)) &
                  ((uint)((ulong)*(undefined8 *)(pObj + -uVar6) >> 0x3f) ^
                  (uint)(uVar11 >> 0x1d) & 7)) << 0x3f;
    }
    if (p_00->fBuiltInSim != 0) {
      uVar11 = *(ulong *)pObj;
      *(ulong *)pObj =
           uVar11 & 0x7fffffffffffffff |
           (ulong)(((uint)(uVar11 >> 0x3d) ^
                   (uint)((ulong)*(undefined8 *)(pObj + -(uVar11 >> 0x20 & 0x1fffffff)) >> 0x3f)) &
                  ((uint)((ulong)*(undefined8 *)(pObj + -(uVar11 & 0x1fffffff)) >> 0x3f) ^
                  (uint)(uVar11 >> 0x1d) & 7)) << 0x3f;
      iVar1 = Gia_ObjId(p_00,pObj);
      Gia_ManBuiltInSimPerform(p_00,iVar1);
    }
    if (p_00->vSuppWords != (Vec_Wrd_t *)0x0) {
      Gia_ManQuantSetSuppAnd(p_00,pObj);
    }
    iVar1 = Gia_ObjId(p_00,pObj);
    pGVar5->Value = iVar1 * 2;
  }
  for (iVar7 = 0; iVar7 < local_40->nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(local_40,iVar7);
    pGVar5 = Gia_ManObj(p,iVar1);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    Gia_ManAppendCo(p_00,pGVar5->Value);
  }
  Vec_IntFree(local_38);
  Vec_IntFree(local_40);
  Vec_IntFree(local_48);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManExtractWin( Gia_Man_t * p, Vec_Int_t * vOuts, int fPoOnly )
{
    Vec_Int_t * vPis, * vPos, * vAnds;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManPrepareWin( p, vOuts, &vPis, &vPos, &vAnds, fPoOnly );
    // create AIG
    pNew = Gia_ManStart( Vec_IntSize(vPis) + Vec_IntSize(vPos) + Vec_IntSize(vAnds) + 1 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObjVec( vPis, p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachObjVec( vAnds, p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachObjVec( vPos, p, pObj, i )
        Gia_ManAppendCo( pNew, pObj->Value );
    Vec_IntFree( vPis );
    Vec_IntFree( vPos );
    Vec_IntFree( vAnds );
    return pNew;
}